

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box_helper.cpp
# Opt level: O0

void ftxui::box_helper::anon_unknown_2::ComputeShrinkEasy
               (vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>
                *elements,int extra_space,int flex_shrink_sum)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int *piVar4;
  int local_40;
  int local_3c;
  reference pEStack_38;
  int added_space;
  Element *element;
  iterator __end2;
  iterator __begin2;
  vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_> *__range2;
  int flex_shrink_sum_local;
  int extra_space_local;
  vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_> *elements_local;
  
  __range2._0_4_ = flex_shrink_sum;
  __range2._4_4_ = extra_space;
  _flex_shrink_sum_local = elements;
  __end2 = std::vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>::
           begin(elements);
  element = (Element *)
            std::vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>::
            end(elements);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<ftxui::box_helper::Element_*,_std::vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>_>
                                *)&element);
    if (!bVar2) break;
    pEStack_38 = __gnu_cxx::
                 __normal_iterator<ftxui::box_helper::Element_*,_std::vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>_>
                 ::operator*(&__end2);
    iVar3 = __range2._4_4_ * pEStack_38->min_size;
    iVar1 = pEStack_38->flex_shrink;
    local_40 = 1;
    piVar4 = std::max<int>((int *)&__range2,&local_40);
    local_3c = (iVar3 * iVar1) / *piVar4;
    __range2._4_4_ = __range2._4_4_ - local_3c;
    __range2._0_4_ = (int)__range2 - pEStack_38->flex_shrink * pEStack_38->min_size;
    pEStack_38->size = pEStack_38->min_size + local_3c;
    __gnu_cxx::
    __normal_iterator<ftxui::box_helper::Element_*,_std::vector<ftxui::box_helper::Element,_std::allocator<ftxui::box_helper::Element>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void ComputeShrinkEasy(std::vector<Element>* elements,
                       int extra_space,
                       int flex_shrink_sum) {
  for (Element& element : *elements) {
    int added_space = extra_space * element.min_size * element.flex_shrink /
                      std::max(flex_shrink_sum, 1);
    extra_space -= added_space;
    flex_shrink_sum -= element.flex_shrink * element.min_size;
    element.size = element.min_size + added_space;
  }
}